

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O0

bool __thiscall
moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
::ImplicitProducer::new_block_index(ImplicitProducer *this)

{
  __int_type_conflict _Var1;
  __pointer_type pBVar2;
  __pointer_type __p;
  BlockIndexEntry *pBVar3;
  BlockIndexEntry **ppBVar4;
  size_t sVar5;
  size_t local_e0;
  size_t local_d8;
  size_t local_c8;
  size_t i_1;
  size_t i;
  __int_type_conflict prevPos;
  __int_type_conflict prevTail;
  BlockIndexEntry **index;
  BlockIndexEntry *entries;
  BlockIndexHeader *header;
  char *raw;
  size_t entryCount;
  size_t prevCapacity;
  __pointer_type prev;
  ImplicitProducer *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  pBVar2 = std::
           atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
           ::load(&this->blockIndex,memory_order_relaxed);
  if (pBVar2 == (__pointer_type)0x0) {
    local_d8 = 0;
    local_e0 = this->nextBlockIndexCapacity;
  }
  else {
    local_e0 = pBVar2->capacity;
    local_d8 = local_e0;
  }
  __p = (__pointer_type)
        ConcurrentQueueDefaultTraits::malloc
                  (local_e0 * 0x10 + 0x36 + this->nextBlockIndexCapacity * 8);
  if (__p == (__pointer_type)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pBVar3 = (BlockIndexEntry *)
             details::
             align_for<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexEntry>
                       ((char *)(__p + 1));
    ppBVar4 = (BlockIndexEntry **)
              details::
              align_for<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexEntry*>
                        ((char *)(pBVar3 + local_e0));
    if (pBVar2 != (__pointer_type)0x0) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      _Var1 = (pBVar2->tail).super___atomic_base<unsigned_long>._M_i;
      i_1 = 0;
      i = _Var1;
      do {
        i = i + 1 & pBVar2->capacity - 1;
        sVar5 = i_1 + 1;
        ppBVar4[i_1] = pBVar2->index[i];
        i_1 = sVar5;
      } while (i != _Var1);
      if (sVar5 != local_d8) {
        __assert_fail("i == prevCapacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/concurrentqueue.h"
                      ,0xb46,
                      "bool moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo *>::ImplicitProducer::new_block_index() [T = loop::MessageLoop::TaskInfo *, Traits = moodycamel::ConcurrentQueueDefaultTraits]"
                     );
      }
    }
    for (local_c8 = 0; local_c8 != local_e0; local_c8 = local_c8 + 1) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      pBVar3[local_c8].key.super___atomic_base<unsigned_long>._M_i = 1;
      ppBVar4[local_d8 + local_c8] = pBVar3 + local_c8;
    }
    __p->prev = pBVar2;
    __p->entries = pBVar3;
    __p->index = ppBVar4;
    __p->capacity = this->nextBlockIndexCapacity;
    sVar5 = this->nextBlockIndexCapacity;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    (__p->tail).super___atomic_base<unsigned_long>._M_i = local_d8 - 1 & sVar5 - 1;
    std::
    atomic<moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::ImplicitProducer::BlockIndexHeader_*>
    ::store(&this->blockIndex,__p,memory_order_release);
    this->nextBlockIndexCapacity = this->nextBlockIndexCapacity << 1;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool new_block_index()
		{
			auto prev = blockIndex.load(std::memory_order_relaxed);
			size_t prevCapacity = prev == nullptr ? 0 : prev->capacity;
			auto entryCount = prev == nullptr ? nextBlockIndexCapacity : prevCapacity;
			auto raw = static_cast<char*>((Traits::malloc)(
				sizeof(BlockIndexHeader) +
				std::alignment_of<BlockIndexEntry>::value - 1 + sizeof(BlockIndexEntry) * entryCount +
				std::alignment_of<BlockIndexEntry*>::value - 1 + sizeof(BlockIndexEntry*) * nextBlockIndexCapacity));
			if (raw == nullptr) {
				return false;
			}
			
			auto header = new (raw) BlockIndexHeader;
			auto entries = reinterpret_cast<BlockIndexEntry*>(details::align_for<BlockIndexEntry>(raw + sizeof(BlockIndexHeader)));
			auto index = reinterpret_cast<BlockIndexEntry**>(details::align_for<BlockIndexEntry*>(reinterpret_cast<char*>(entries) + sizeof(BlockIndexEntry) * entryCount));
			if (prev != nullptr) {
				auto prevTail = prev->tail.load(std::memory_order_relaxed);
				auto prevPos = prevTail;
				size_t i = 0;
				do {
					prevPos = (prevPos + 1) & (prev->capacity - 1);
					index[i++] = prev->index[prevPos];
				} while (prevPos != prevTail);
				assert(i == prevCapacity);
			}
			for (size_t i = 0; i != entryCount; ++i) {
				new (entries + i) BlockIndexEntry;
				entries[i].key.store(INVALID_BLOCK_BASE, std::memory_order_relaxed);
				index[prevCapacity + i] = entries + i;
			}
			header->prev = prev;
			header->entries = entries;
			header->index = index;
			header->capacity = nextBlockIndexCapacity;
			header->tail.store((prevCapacity - 1) & (nextBlockIndexCapacity - 1), std::memory_order_relaxed);
			
			blockIndex.store(header, std::memory_order_release);
			
			nextBlockIndexCapacity <<= 1;
			
			return true;
		}